

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderBitfieldOperationTests.cpp
# Opt level: O2

void __thiscall
glcts::ShaderBitfieldOperationCase::~ShaderBitfieldOperationCase(ShaderBitfieldOperationCase *this)

{
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ShaderBitfieldOperationCase_01de5240;
  std::__cxx11::string::~string((string *)&this->m_testStatement);
  tcu::TestCase::~TestCase((TestCase *)this);
  return;
}

Assistant:

ShaderBitfieldOperationCase::~ShaderBitfieldOperationCase()
{
}